

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::TreeEnsembleClassifier::MergeFrom
          (TreeEnsembleClassifier *this,TreeEnsembleClassifier *from)

{
  void *pvVar1;
  LogMessage *other;
  TreeEnsembleParameters *pTVar2;
  StringVector *pSVar3;
  Int64Vector *pIVar4;
  StringVector *from_00;
  Int64Vector *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/TreeEnsemble.pb.cc"
               ,0x653);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if ((from != (TreeEnsembleClassifier *)&_TreeEnsembleClassifier_default_instance_) &&
     (from->treeensemble_ != (TreeEnsembleParameters *)0x0)) {
    if (this->treeensemble_ == (TreeEnsembleParameters *)0x0) {
      pTVar2 = (TreeEnsembleParameters *)operator_new(0x50);
      TreeEnsembleParameters::TreeEnsembleParameters(pTVar2);
      this->treeensemble_ = pTVar2;
    }
    pTVar2 = from->treeensemble_;
    if (pTVar2 == (TreeEnsembleParameters *)0x0) {
      pTVar2 = (TreeEnsembleParameters *)&_TreeEnsembleParameters_default_instance_;
    }
    TreeEnsembleParameters::MergeFrom(this->treeensemble_,pTVar2);
  }
  if (from->postevaluationtransform_ != 0) {
    this->postevaluationtransform_ = from->postevaluationtransform_;
  }
  if (from->_oneof_case_[0] == 0x65) {
    if (this->_oneof_case_[0] != 0x65) {
      clear_ClassLabels(this);
      this->_oneof_case_[0] = 0x65;
      pIVar4 = (Int64Vector *)operator_new(0x28);
      Int64Vector::Int64Vector(pIVar4);
      (this->ClassLabels_).int64classlabels_ = pIVar4;
    }
    pIVar4 = (this->ClassLabels_).int64classlabels_;
    if (from->_oneof_case_[0] == 0x65) {
      from_01 = (from->ClassLabels_).int64classlabels_;
    }
    else {
      from_01 = Int64Vector::default_instance();
    }
    Int64Vector::MergeFrom(pIVar4,from_01);
  }
  else if (from->_oneof_case_[0] == 100) {
    if (this->_oneof_case_[0] != 100) {
      clear_ClassLabels(this);
      this->_oneof_case_[0] = 100;
      pSVar3 = (StringVector *)operator_new(0x30);
      StringVector::StringVector(pSVar3);
      (this->ClassLabels_).stringclasslabels_ = pSVar3;
    }
    pSVar3 = (this->ClassLabels_).stringclasslabels_;
    if (from->_oneof_case_[0] == 100) {
      from_00 = (from->ClassLabels_).stringclasslabels_;
    }
    else {
      from_00 = StringVector::default_instance();
    }
    StringVector::MergeFrom(pSVar3,from_00);
  }
  return;
}

Assistant:

void TreeEnsembleClassifier::MergeFrom(const TreeEnsembleClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.TreeEnsembleClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_treeensemble()) {
    mutable_treeensemble()->::CoreML::Specification::TreeEnsembleParameters::MergeFrom(from.treeensemble());
  }
  if (from.postevaluationtransform() != 0) {
    set_postevaluationtransform(from.postevaluationtransform());
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
}